

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

bool google::protobuf::compiler::anon_unknown_5::ContainsProto3Optional(Descriptor *desc)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  FieldDescriptor *pFVar4;
  OneofDescriptor *pOVar5;
  Descriptor *desc_00;
  int i;
  int iVar6;
  int i_1;
  
  for (iVar6 = 0; iVar6 < *(int *)(desc + 4); iVar6 = iVar6 + 1) {
    pFVar4 = Descriptor::field(desc,iVar6);
    pOVar5 = FieldDescriptor::real_containing_oneof(pFVar4);
    if (pOVar5 == (OneofDescriptor *)0x0) {
      pFVar4 = Descriptor::field(desc,iVar6);
      pOVar5 = FieldDescriptor::containing_oneof(pFVar4);
      if (pOVar5 != (OneofDescriptor *)0x0) {
        return true;
      }
    }
  }
  iVar6 = 0;
  do {
    iVar1 = *(int *)(desc + 0x80);
    bVar2 = iVar6 < iVar1;
    if (iVar1 <= iVar6) {
      return bVar2;
    }
    desc_00 = Descriptor::nested_type(desc,iVar6);
    bVar3 = ContainsProto3Optional(desc_00);
    iVar6 = iVar6 + 1;
  } while (!bVar3);
  return bVar2;
}

Assistant:

bool ContainsProto3Optional(const Descriptor* desc) {
  for (int i = 0; i < desc->field_count(); ++i) {
    if (desc->field(i)->real_containing_oneof() == nullptr &&
        desc->field(i)->containing_oneof() != nullptr) {
      return true;
    }
  }
  for (int i = 0; i < desc->nested_type_count(); ++i) {
    if (ContainsProto3Optional(desc->nested_type(i))) {
      return true;
    }
  }
  return false;
}